

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O0

_Bool borg_think_home_buy_swap_armour(void)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  borg_item_conflict *item;
  int32_t old_armour_swap_value;
  int old_armour_swap;
  int32_t old_weapon_swap_value;
  int old_weapon_swap;
  _Bool fix;
  int32_t b_p;
  int32_t p;
  int b_n;
  int n;
  int hole;
  
  iVar5 = armour_swap_value;
  iVar4 = armour_swap;
  iVar3 = weapon_swap_value;
  iVar2 = weapon_swap;
  b_p = -1;
  bVar1 = false;
  if ((armour_swap < 1) || (armour_swap_value < 1)) {
    b_n = borg_first_empty_inventory_slot();
    armour_swap_value = -1;
  }
  else {
    b_n = armour_swap + -1;
  }
  if (b_n == -1) {
    n._3_1_ = false;
  }
  else {
    old_weapon_swap = armour_swap_value;
    for (p = 0; p < (int)(uint)z_info->store_inven_max; p = p + 1) {
      if (borg_shops[7].ware[p].iqty != '\0') {
        borg_shops[7].ware[p].iqty = borg_shops[7].ware[p].iqty + 0xff;
        memcpy(borg_items + b_n,borg_safe_shops[7].ware + p,0x388);
        borg_items[b_n].iqty = '\x01';
        bVar1 = true;
        borg_notice(true);
        iVar6 = armour_swap_value;
        borg_items[b_n].iqty = '\0';
        memcpy(borg_shops[7].ware + p,borg_safe_shops[7].ware + p,0x388);
        if (old_weapon_swap < iVar6) {
          b_p = p;
          old_weapon_swap = iVar6;
        }
      }
    }
    if (bVar1) {
      borg_notice(true);
    }
    weapon_swap = iVar2;
    weapon_swap_value = iVar3;
    armour_swap = iVar4;
    if ((b_p < 0) || (old_weapon_swap <= armour_swap_value)) {
      n._3_1_ = false;
      armour_swap_value = iVar5;
    }
    else {
      borg.goal.shop = 7;
      borg.goal.ware = (int16_t)b_p;
      n._3_1_ = true;
      armour_swap_value = iVar5;
    }
  }
  return n._3_1_;
}

Assistant:

bool borg_think_home_buy_swap_armour(void)
{
    int hole;

    int     n, b_n = -1;
    int32_t p, b_p = 0L;
    bool    fix = false;
    int     old_weapon_swap;
    int32_t old_weapon_swap_value;
    int     old_armour_swap;
    int32_t old_armour_swap_value;

    /* save the current values */
    old_weapon_swap       = weapon_swap;
    old_weapon_swap_value = weapon_swap_value;
    old_armour_swap       = armour_swap;
    old_armour_swap_value = armour_swap_value;

    if (armour_swap <= 0 || armour_swap_value <= 0) {
        hole              = borg_first_empty_inventory_slot();
        armour_swap_value = -1L;
    } else {
        hole = armour_swap - 1;
    }

    if (hole == -1)
        return false;

    /* Extract the "power" */
    b_p = armour_swap_value;

    /* Scan the home */
    for (n = 0; n < z_info->store_inven_max; n++) {
        borg_item *item = &borg_shops[BORG_HOME].ware[n];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Remove one item from shop */
        borg_shops[BORG_HOME].ware[n].iqty--;

        /* Move new item into inventory */
        memcpy(&borg_items[hole], &borg_safe_shops[BORG_HOME].ware[n],
            sizeof(borg_item));

        /* Only a single item */
        borg_items[hole].iqty = 1;

        /* Fix later */
        fix = true;

        /* Examine the inventory (false)*/
        borg_notice(true);

        /* Evaluate the new equipment */
        p = armour_swap_value;

        /* Restore hole */
        borg_items[hole].iqty = 0;

        /* Restore shop item */
        memcpy(&borg_shops[BORG_HOME].ware[n],
            &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

        /* Ignore "silly" purchases */
        if (p <= b_p)
            continue;

        /* Save the item and value */
        b_n = n;
        b_p = p;
    }

    /* Examine the inventory */
    if (fix)
        borg_notice(true);

    /* Buy something */
    if ((b_n >= 0) && (b_p > armour_swap_value)) {
        /* Go to the home */
        borg.goal.shop = BORG_HOME;

        /* Buy that item */
        borg.goal.ware = b_n;

        /* Restore the values */
        weapon_swap       = old_weapon_swap;
        weapon_swap_value = old_weapon_swap_value;
        armour_swap       = old_armour_swap;
        armour_swap_value = old_armour_swap_value;

        /* Success */
        return true;
    }
    /* Restore the values */
    weapon_swap       = old_weapon_swap;
    weapon_swap_value = old_weapon_swap_value;
    armour_swap       = old_armour_swap;
    armour_swap_value = old_armour_swap_value;

    /* Nope */
    return false;
}